

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxout.cpp
# Opt level: O3

void __thiscall
ConfidentialTxOut_Constractor4_Test::TestBody(ConfidentialTxOut_Constractor4_Test *this)

{
  undefined1 lhs [8];
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  char *pcVar3;
  ulong uVar4;
  size_t sVar5;
  Amount AVar6;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar;
  ConfidentialTxOut txout;
  undefined1 local_1b8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  undefined1 local_198 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [2];
  undefined1 local_160 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  ulong local_140;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  int64_t local_130;
  Amount local_128;
  ConfidentialTxOut local_118;
  
  AVar6 = cfd::core::Amount::CreateBySatoshiAmount(100000000);
  local_128.amount_ = AVar6.amount_;
  local_128.ignore_check_ = AVar6.ignore_check_;
  cfd::core::ConfidentialTxOut::ConfidentialTxOut(&local_118,&exp_asset,&local_128);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)local_198,&local_118.asset_);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
            ((string *)local_1b8,(ConfidentialAssetId *)local_198);
  lhs = local_1b8;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_160,&exp_asset);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_140,"txout.GetAsset().GetHex().c_str()","exp_asset.GetHex().c_str()"
             ,(char *)lhs,(char *)local_160);
  if (local_160 != (undefined1  [8])&local_150) {
    operator_delete((void *)local_160,local_150._M_allocated_capacity + 1);
  }
  if (local_1b8 != (undefined1  [8])&local_1a8) {
    operator_delete((void *)local_1b8,local_1a8._M_allocated_capacity + 1);
  }
  local_198._0_8_ = &PTR__ConfidentialAssetId_007e7ad0;
  if ((pointer)local_198._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_198._8_8_,local_188[0]._8_8_ - local_198._8_8_);
  }
  if (local_140._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_198);
    if (local_138.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_138.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x9b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1b8,(Message *)local_198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1b8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_198._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_138,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)local_198,&local_118.confidential_value_);
  AVar6 = cfd::core::ConfidentialValue::GetAmount((ConfidentialValue *)local_198);
  local_160 = (undefined1  [8])AVar6.amount_;
  local_158.ptr_._0_1_ = AVar6.ignore_check_;
  local_140 = cfd::core::Amount::GetSatoshiValue((Amount *)local_160);
  local_130 = cfd::core::Amount::GetSatoshiValue(&local_128);
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)local_1b8,"txout.GetConfidentialValue().GetAmount().GetSatoshiValue()",
             "amount.GetSatoshiValue()",(long *)&local_140,&local_130);
  local_198._0_8_ = &PTR__ConfidentialValue_007e7aa0;
  if ((pointer)local_198._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_198._8_8_,local_188[0]._8_8_ - local_198._8_8_);
  }
  if (local_1b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_198);
    if (sStack_1b0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((sStack_1b0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x9d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_160,(Message *)local_198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_160);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_198._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_1b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::AbstractTxOut::GetLockingScript((Script *)local_198,&local_118.super_AbstractTxOut);
  cfd::core::Script::GetHex_abi_cxx11_((string *)local_1b8,(Script *)local_198);
  pcVar3 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)local_160,"txout.GetLockingScript().GetHex().c_str()","\"\"",
             (char *)local_1b8,"");
  if (local_1b8 != (undefined1  [8])&local_1a8) {
    operator_delete((void *)local_1b8,local_1a8._M_allocated_capacity + 1);
  }
  cfd::core::Script::~Script((Script *)local_198);
  if (local_160[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_198);
    if ((undefined8 *)CONCAT71(local_158.ptr_._1_7_,local_158.ptr_._0_1_) != (undefined8 *)0x0) {
      pcVar3 = *(char **)CONCAT71(local_158.ptr_._1_7_,local_158.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x9e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1b8,(Message *)local_198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1b8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_198._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_158,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)local_198,&local_118.nonce_);
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_
            ((string *)local_1b8,(ConfidentialNonce *)local_198);
  pcVar3 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)local_160,"txout.GetNonce().GetHex().c_str()","\"\"",(char *)local_1b8,"");
  if (local_1b8 != (undefined1  [8])&local_1a8) {
    operator_delete((void *)local_1b8,local_1a8._M_allocated_capacity + 1);
  }
  local_198._0_8_ = &PTR__ConfidentialNonce_007e7a70;
  if ((pointer)local_198._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_198._8_8_,local_188[0]._8_8_ - local_198._8_8_);
  }
  if (local_160[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_198);
    if ((undefined8 *)CONCAT71(local_158.ptr_._1_7_,local_158.ptr_._0_1_) != (undefined8 *)0x0) {
      pcVar3 = *(char **)CONCAT71(local_158.ptr_._1_7_,local_158.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x9f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1b8,(Message *)local_198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1b8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_198._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_158,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1b8 = (undefined1  [8])0x0;
  sStack_1b0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_1a8._M_allocated_capacity = 0;
  uVar4 = (long)local_118.range_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_118.range_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar4 == 0) {
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    sVar5 = 0;
  }
  else {
    if ((long)uVar4 < 0) {
      std::__throw_bad_alloc();
    }
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             operator_new(uVar4);
    sVar5 = (long)local_118.range_proof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_118.range_proof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_1a8._M_allocated_capacity = uVar4 + (long)pbVar2;
  local_1b8 = (undefined1  [8])pbVar2;
  if (local_118.range_proof_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_118.range_proof_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    sStack_1b0.ptr_ = pbVar2;
    memmove(pbVar2,local_118.range_proof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar5);
  }
  sStack_1b0.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)&(pbVar2->_M_dataplus)._M_p + sVar5);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_198,(ByteData *)local_1b8);
  pcVar3 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)local_160,"txout.GetRangeProof().GetHex().c_str()","\"\"",
             (char *)local_198._0_8_,"");
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_198 + 0x10))
  {
    operator_delete((void *)local_198._0_8_,(ulong)(local_188[0]._M_allocated_capacity + 1));
  }
  if (local_1b8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1b8,local_1a8._M_allocated_capacity - (long)local_1b8);
  }
  if (local_160[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_198);
    if ((undefined8 *)CONCAT71(local_158.ptr_._1_7_,local_158.ptr_._0_1_) != (undefined8 *)0x0) {
      pcVar3 = *(char **)CONCAT71(local_158.ptr_._1_7_,local_158.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xa0,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1b8,(Message *)local_198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1b8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_198._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_158,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1b8 = (undefined1  [8])0x0;
  sStack_1b0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_1a8._M_allocated_capacity = 0;
  uVar4 = (long)local_118.surjection_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_118.surjection_proof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar4 == 0) {
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    sVar5 = 0;
  }
  else {
    if ((long)uVar4 < 0) {
      std::__throw_bad_alloc();
    }
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             operator_new(uVar4);
    sVar5 = (long)local_118.surjection_proof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_118.surjection_proof_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
  }
  local_1a8._M_allocated_capacity = uVar4 + (long)pbVar2;
  local_1b8 = (undefined1  [8])pbVar2;
  if (local_118.surjection_proof_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_118.surjection_proof_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    sStack_1b0.ptr_ = pbVar2;
    memmove(pbVar2,local_118.surjection_proof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar5);
  }
  sStack_1b0.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)&(pbVar2->_M_dataplus)._M_p + sVar5);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_198,(ByteData *)local_1b8);
  pcVar3 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)local_160,"txout.GetSurjectionProof().GetHex().c_str()","\"\"",
             (char *)local_198._0_8_,"");
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_198 + 0x10))
  {
    operator_delete((void *)local_198._0_8_,(ulong)(local_188[0]._M_allocated_capacity + 1));
  }
  if (local_1b8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1b8,local_1a8._M_allocated_capacity - (long)local_1b8);
  }
  if (local_160[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_198);
    if ((undefined8 *)CONCAT71(local_158.ptr_._1_7_,local_158.ptr_._0_1_) != (undefined8 *)0x0) {
      pcVar3 = *(char **)CONCAT71(local_158.ptr_._1_7_,local_158.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xa1,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1b8,(Message *)local_198);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1b8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_198._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_158,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  AVar6 = cfd::core::AbstractTxOut::GetValue(&local_118.super_AbstractTxOut);
  local_1b8 = (undefined1  [8])AVar6.amount_;
  sStack_1b0.ptr_._0_1_ = AVar6.ignore_check_;
  local_160 = (undefined1  [8])cfd::core::Amount::GetSatoshiValue((Amount *)local_1b8);
  local_140 = local_140 & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_198,"txout.GetValue().GetSatoshiValue()","0",(long *)local_160,
             (int *)&local_140);
  if (local_198[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1b8);
    if ((pointer)local_198._8_8_ == (pointer)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_198._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0xa2,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_160,(Message *)local_1b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_160);
    if (local_1b8 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_1b8 != (undefined1  [8])0x0)) {
        (**(code **)(*(long *)local_1b8 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_198 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::ConfidentialTxOut::~ConfidentialTxOut(&local_118);
  return;
}

Assistant:

TEST(ConfidentialTxOut, Constractor4) {
  // ConfidentialAssetId, ConfidentialValue
  Amount amount(Amount::CreateBySatoshiAmount(100000000));
  ConfidentialTxOut txout(exp_asset, amount);
  EXPECT_STREQ(txout.GetAsset().GetHex().c_str(), exp_asset.GetHex().c_str());
  EXPECT_EQ(txout.GetConfidentialValue().GetAmount().GetSatoshiValue(),
               amount.GetSatoshiValue());
  EXPECT_STREQ(txout.GetLockingScript().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetNonce().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetRangeProof().GetHex().c_str(), "");
  EXPECT_STREQ(txout.GetSurjectionProof().GetHex().c_str(), "");
  EXPECT_EQ(txout.GetValue().GetSatoshiValue(), 0);
}